

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dired.c
# Opt level: O1

int dired(int f,int n)

{
  int iVar1;
  char *pcVar2;
  buffer *bp;
  char local_418 [8];
  char dname [1024];
  
  if (curbp->b_fname[0] == '\0') {
    pcVar2 = getcwd(local_418,0x400);
    if (pcVar2 == (char *)0x0) {
      local_418[0] = '\0';
    }
  }
  else {
    strlcpy(local_418,curbp->b_fname,0x400);
    pcVar2 = strrchr(local_418,0x2f);
    if (pcVar2 != (char *)0x0) {
      pcVar2[1] = '\0';
    }
  }
  pcVar2 = eread("Dired (directory): ",local_418,0x400,0x38);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = 0;
    if (*pcVar2 != '\0') {
      bp = dired_(pcVar2);
      iVar1 = 0;
      if (bp != (buffer *)0x0) {
        curbp = bp;
        iVar1 = showbuffer(bp,curwp,0x18);
      }
    }
  }
  return iVar1;
}

Assistant:

int
dired(int f, int n)
{
	char		 dname[NFILEN], *bufp, *slash;
	struct buffer	*bp;

	if (curbp->b_fname[0] != '\0') {
		(void)strlcpy(dname, curbp->b_fname, sizeof(dname));
		if ((slash = strrchr(dname, '/')) != NULL) {
			*(slash + 1) = '\0';
		}
	} else {
		if (getcwd(dname, sizeof(dname)) == NULL)
			dname[0] = '\0';
	}

	if ((bufp = eread("Dired (directory): ", dname, NFILEN,
	    EFDEF | EFNEW | EFCR)) == NULL)
		return (ABORT);
	if (bufp[0] == '\0')
		return (FALSE);
	if ((bp = dired_(bufp)) == NULL)
		return (FALSE);

	curbp = bp;
	return (showbuffer(bp, curwp, WFFULL | WFMODE));
}